

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skeleton.cxx
# Opt level: O0

void __thiscall xray_re::s_joint_ik_data::reset(s_joint_ik_data *this)

{
  long local_18;
  uint_fast32_t i;
  s_joint_ik_data *this_local;
  
  this->type = 0;
  local_18 = 3;
  while (local_18 != 0) {
    s_joint_limit::reset(this->limits + local_18 + -1);
    local_18 = local_18 + -1;
  }
  this->spring_factor = 1.0;
  this->damping_factor = 1.0;
  this->ik_flags = 0;
  this->break_force = 0.0;
  this->break_torque = 0.0;
  this->friction = 1.0;
  return;
}

Assistant:

void s_joint_ik_data::reset()
{
	type = JT_RIGID;
	for (uint_fast32_t i = 3; i != 0;)
		limits[--i].reset();
	spring_factor = 1.f;
	damping_factor = 1.f;
	ik_flags = 0;
	break_force = 0;
	break_torque = 0;
	friction = 1.f;
}